

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_pileup_engine.cpp
# Opt level: O0

bool __thiscall
BamTools::PileupEngine::PileupEnginePrivate::AddAlignment
          (PileupEnginePrivate *this,BamAlignment *al)

{
  bool bVar1;
  ostream *poVar2;
  value_type *in_RSI;
  vector<BamTools::BamAlignment,_std::allocator<BamTools::BamAlignment>_> *in_RDI;
  PileupEnginePrivate *unaff_retaddr;
  vector<BamTools::BamAlignment,_std::allocator<BamTools::BamAlignment>_> *pvVar3;
  
  if (((ulong)in_RDI[2].
              super__Vector_base<BamTools::BamAlignment,_std::allocator<BamTools::BamAlignment>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage & 1) == 0) {
    if (in_RSI->RefID ==
        *(int *)&(in_RDI->
                 super__Vector_base<BamTools::BamAlignment,_std::allocator<BamTools::BamAlignment>_>
                 )._M_impl.super__Vector_impl_data._M_start) {
      if (in_RSI->Position ==
          *(int *)((long)&(in_RDI->
                          super__Vector_base<BamTools::BamAlignment,_std::allocator<BamTools::BamAlignment>_>
                          )._M_impl.super__Vector_impl_data._M_start + 4)) {
        std::vector<BamTools::BamAlignment,_std::allocator<BamTools::BamAlignment>_>::push_back
                  (in_RDI,in_RSI);
      }
      else {
        pvVar3 = in_RDI;
        if (in_RSI->Position <
            *(int *)((long)&(in_RDI->
                            super__Vector_base<BamTools::BamAlignment,_std::allocator<BamTools::BamAlignment>_>
                            )._M_impl.super__Vector_impl_data._M_start + 4)) {
          poVar2 = std::operator<<((ostream *)&std::cerr,
                                   "Pileup::Run() : Data not sorted correctly!");
          std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
          return false;
        }
        while (*(int *)((long)&(in_RDI->
                               super__Vector_base<BamTools::BamAlignment,_std::allocator<BamTools::BamAlignment>_>
                               )._M_impl.super__Vector_impl_data._M_start + 4) < in_RSI->Position) {
          ApplyVisitors(unaff_retaddr);
          *(int *)((long)&(in_RDI->
                          super__Vector_base<BamTools::BamAlignment,_std::allocator<BamTools::BamAlignment>_>
                          )._M_impl.super__Vector_impl_data._M_start + 4) =
               *(int *)((long)&(in_RDI->
                               super__Vector_base<BamTools::BamAlignment,_std::allocator<BamTools::BamAlignment>_>
                               )._M_impl.super__Vector_impl_data._M_start + 4) + 1;
        }
        std::vector<BamTools::BamAlignment,_std::allocator<BamTools::BamAlignment>_>::push_back
                  (pvVar3,in_RSI);
      }
    }
    else {
      pvVar3 = in_RDI;
      if (in_RSI->RefID <
          *(int *)&(in_RDI->
                   super__Vector_base<BamTools::BamAlignment,_std::allocator<BamTools::BamAlignment>_>
                   )._M_impl.super__Vector_impl_data._M_start) {
        poVar2 = std::operator<<((ostream *)&std::cerr,"Pileup::Run() : Data not sorted correctly!")
        ;
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        return false;
      }
      while (bVar1 = std::vector<BamTools::BamAlignment,_std::allocator<BamTools::BamAlignment>_>::
                     empty(pvVar3), ((bVar1 ^ 0xffU) & 1) != 0) {
        ApplyVisitors(unaff_retaddr);
        *(int *)((long)&(in_RDI->
                        super__Vector_base<BamTools::BamAlignment,_std::allocator<BamTools::BamAlignment>_>
                        )._M_impl.super__Vector_impl_data._M_start + 4) =
             *(int *)((long)&(in_RDI->
                             super__Vector_base<BamTools::BamAlignment,_std::allocator<BamTools::BamAlignment>_>
                             )._M_impl.super__Vector_impl_data._M_start + 4) + 1;
      }
      std::vector<BamTools::BamAlignment,_std::allocator<BamTools::BamAlignment>_>::clear
                ((vector<BamTools::BamAlignment,_std::allocator<BamTools::BamAlignment>_> *)0x2bd0eb
                );
      std::vector<BamTools::BamAlignment,_std::allocator<BamTools::BamAlignment>_>::push_back
                (pvVar3,in_RSI);
      *(int32_t *)
       &(in_RDI->super__Vector_base<BamTools::BamAlignment,_std::allocator<BamTools::BamAlignment>_>
        )._M_impl.super__Vector_impl_data._M_start = in_RSI->RefID;
      *(int32_t *)
       ((long)&(in_RDI->
               super__Vector_base<BamTools::BamAlignment,_std::allocator<BamTools::BamAlignment>_>).
               _M_impl.super__Vector_impl_data._M_start + 4) = in_RSI->Position;
    }
  }
  else {
    *(int32_t *)
     &(in_RDI->super__Vector_base<BamTools::BamAlignment,_std::allocator<BamTools::BamAlignment>_>).
      _M_impl.super__Vector_impl_data._M_start = in_RSI->RefID;
    *(int32_t *)
     ((long)&(in_RDI->
             super__Vector_base<BamTools::BamAlignment,_std::allocator<BamTools::BamAlignment>_>).
             _M_impl.super__Vector_impl_data._M_start + 4) = in_RSI->Position;
    pvVar3 = in_RDI;
    std::vector<BamTools::BamAlignment,_std::allocator<BamTools::BamAlignment>_>::clear
              ((vector<BamTools::BamAlignment,_std::allocator<BamTools::BamAlignment>_> *)0x2bcf77);
    std::vector<BamTools::BamAlignment,_std::allocator<BamTools::BamAlignment>_>::push_back
              (pvVar3,in_RSI);
    *(undefined1 *)
     &in_RDI[2].super__Vector_base<BamTools::BamAlignment,_std::allocator<BamTools::BamAlignment>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = 0;
  }
  return true;
}

Assistant:

bool PileupEngine::PileupEnginePrivate::AddAlignment(const BamAlignment& al)
{

    // if first time
    if (IsFirstAlignment) {

        // set initial markers
        CurrentId = al.RefID;
        CurrentPosition = al.Position;

        // store first entry
        CurrentAlignments.clear();
        CurrentAlignments.push_back(al);

        // set flag & return
        IsFirstAlignment = false;
        return true;
    }

    // if same reference
    if (al.RefID == CurrentId) {

        // if same position, store and move on
        if (al.Position == CurrentPosition) CurrentAlignments.push_back(al);

        // if less than CurrentPosition - sorting error => ABORT
        else if (al.Position < CurrentPosition) {
            std::cerr << "Pileup::Run() : Data not sorted correctly!" << std::endl;
            return false;
        }

        // else print pileup data until 'catching up' to CurrentPosition
        else {
            while (al.Position > CurrentPosition) {
                ApplyVisitors();
                ++CurrentPosition;
            }
            CurrentAlignments.push_back(al);
        }
    }

    // if reference ID less than CurrentId - sorting error => ABORT
    else if (al.RefID < CurrentId) {
        std::cerr << "Pileup::Run() : Data not sorted correctly!" << std::endl;
        return false;
    }

    // else moved forward onto next reference
    else {

        // print any remaining pileup data from previous reference
        while (!CurrentAlignments.empty()) {
            ApplyVisitors();
            ++CurrentPosition;
        }

        // store first entry on this new reference, update markers
        CurrentAlignments.clear();
        CurrentAlignments.push_back(al);
        CurrentId = al.RefID;
        CurrentPosition = al.Position;
    }

    return true;
}